

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_textedit_undo(nk_text_edit *state)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  short sVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  short *psVar11;
  int len_00;
  int iVar12;
  uint pos;
  int len;
  nk_rune local_5c;
  ulong local_58;
  nk_rune *local_50;
  long local_48;
  short *local_40;
  int local_34;
  
  lVar8 = (long)(state->undo).undo_point;
  if (lVar8 != 0) {
    pos = (state->undo).undo_rec[lVar8 + -1].where;
    sVar1 = (state->undo).undo_rec[lVar8 + -1].insert_length;
    sVar2 = (state->undo).undo_rec[lVar8 + -1].delete_length;
    len_00 = (int)sVar2;
    lVar8 = (long)(state->undo).undo_rec[lVar8 + -1].char_storage;
    uVar9 = (ulong)(state->undo).redo_point;
    (state->undo).undo_rec[uVar9 - 1].char_storage = -1;
    (state->undo).undo_rec[uVar9 - 1].insert_length = sVar2;
    (state->undo).undo_rec[uVar9 - 1].delete_length = sVar1;
    (state->undo).undo_rec[uVar9 - 1].where = pos;
    if (sVar2 != 0) {
      local_48 = lVar8;
      if ((state->undo).undo_char_point + len_00 < 999) {
        local_50 = (state->undo).undo_char;
        local_58 = (ulong)pos;
        while( true ) {
          iVar12 = (state->undo).undo_char_point + len_00;
          sVar3 = (state->undo).redo_char_point;
          sVar7 = (short)uVar9;
          if (iVar12 <= sVar3) break;
          if (sVar7 < 99) {
            if (-1 < (state->undo).undo_rec[0x62].char_storage) {
              sVar4 = (state->undo).undo_rec[0x62].insert_length;
              sVar7 = sVar3 + sVar4;
              (state->undo).redo_char_point = sVar7;
              nk_memcopy(local_50 + sVar7,local_50 + sVar7 + -(long)sVar4,999 - (long)sVar7);
              sVar7 = (state->undo).redo_point;
              lVar8 = (long)sVar7;
              if (lVar8 < 0x62) {
                lVar10 = lVar8 + -0x62;
                psVar11 = &(state->undo).undo_rec[lVar8].char_storage;
                do {
                  if (-1 < *psVar11) {
                    *psVar11 = *psVar11 + sVar4;
                  }
                  psVar11 = psVar11 + 6;
                  lVar10 = lVar10 + 1;
                } while (lVar10 != 0);
              }
            }
            sVar7 = sVar7 + 1;
            (state->undo).redo_point = sVar7;
            if (sVar7 != 99) {
              lVar8 = (long)sVar7;
              nk_memcopy((state->undo).undo_rec + lVar8 + -1,(state->undo).undo_rec + lVar8,
                         (99 - lVar8) * 0xc);
              uVar9 = (ulong)(ushort)(state->undo).redo_point;
              goto LAB_0012b03a;
            }
            goto LAB_0012b0cf;
          }
LAB_0012b03a:
          if ((short)uVar9 == 99) goto LAB_0012b0cf;
        }
        (state->undo).undo_rec[(long)sVar7 + -1].char_storage = sVar3 - sVar2;
        (state->undo).redo_char_point = sVar3 - sVar2;
        pos = (uint)local_58;
        if (sVar2 < 1) goto LAB_0012b0dd;
        local_40 = &(state->undo).undo_rec[(long)sVar7 + -1].char_storage;
        lVar8 = 0;
        do {
          local_5c = 0;
          nk_str_at_const(&state->string,(int)local_58 + (int)lVar8,&local_5c,&local_34);
          local_50[*local_40 + lVar8] = local_5c;
          lVar8 = lVar8 + 1;
        } while (len_00 != (int)lVar8);
LAB_0012b0cf:
        pos = (uint)local_58;
        if (sVar3 < iVar12) {
          return;
        }
        goto LAB_0012b0dd;
      }
      (state->undo).undo_rec[uVar9 - 1].insert_length = 0;
LAB_0012b0dd:
      nk_str_delete_runes(&state->string,pos,len_00);
      lVar8 = local_48;
    }
    if (sVar1 != 0) {
      nk_str_insert_text_runes(&state->string,pos,(state->undo).undo_char + lVar8,(int)sVar1);
      psVar11 = &(state->undo).undo_char_point;
      *psVar11 = *psVar11 - sVar1;
    }
    state->cursor = (int)(short)(sVar1 + (short)pos);
    uVar5 = (state->undo).undo_point;
    uVar6 = (state->undo).redo_point;
    (state->undo).undo_point = uVar5 + -1;
    (state->undo).redo_point = uVar6 + -1;
  }
  return;
}

Assistant:

NK_API void
nk_textedit_undo(struct nk_text_edit *state)
{
    struct nk_text_undo_state *s = &state->undo;
    struct nk_text_undo_record u, *r;
    if (s->undo_point == 0)
        return;

    /* we need to do two things: apply the undo record, and create a redo record */
    u = s->undo_rec[s->undo_point-1];
    r = &s->undo_rec[s->redo_point-1];
    r->char_storage = -1;

    r->insert_length = u.delete_length;
    r->delete_length = u.insert_length;
    r->where = u.where;

    if (u.delete_length)
    {
       /*   if the undo record says to delete characters, then the redo record will
            need to re-insert the characters that get deleted, so we need to store
            them.
            there are three cases:
                - there's enough room to store the characters
                - characters stored for *redoing* don't leave room for redo
                - characters stored for *undoing* don't leave room for redo
            if the last is true, we have to bail */
        if (s->undo_char_point + u.delete_length >= NK_TEXTEDIT_UNDOCHARCOUNT) {
            /* the undo records take up too much character space; there's no space
            * to store the redo characters */
            r->insert_length = 0;
        } else {
            int i;
            /* there's definitely room to store the characters eventually */
            while (s->undo_char_point + u.delete_length > s->redo_char_point) {
                /* there's currently not enough room, so discard a redo record */
                nk_textedit_discard_redo(s);
                /* should never happen: */
                if (s->redo_point == NK_TEXTEDIT_UNDOSTATECOUNT)
                    return;
            }

            r = &s->undo_rec[s->redo_point-1];
            r->char_storage = (short)(s->redo_char_point - u.delete_length);
            s->redo_char_point = (short)(s->redo_char_point -  u.delete_length);

            /* now save the characters */
            for (i=0; i < u.delete_length; ++i)
                s->undo_char[r->char_storage + i] =
                    nk_str_rune_at(&state->string, u.where + i);
        }
        /* now we can carry out the deletion */
        nk_str_delete_runes(&state->string, u.where, u.delete_length);
    }

    /* check type of recorded action: */
    if (u.insert_length) {
        /* easy case: was a deletion, so we need to insert n characters */
        nk_str_insert_text_runes(&state->string, u.where,
            &s->undo_char[u.char_storage], u.insert_length);
        s->undo_char_point = (short)(s->undo_char_point - u.insert_length);
    }
    state->cursor = (short)(u.where + u.insert_length);

    s->undo_point--;
    s->redo_point--;
}